

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O1

void __thiscall
brynet::net::TcpService::startWorkerThread
          (TcpService *this,size_t threadNum,FRAME_CALLBACK *callback)

{
  pointer pfVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  element_type *peVar6;
  int iVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  undefined8 uVar10;
  bool *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  EventLoop *this_01;
  long *local_e0;
  pthread_mutex_t *local_d8;
  pthread_mutex_t *local_d0;
  shared_ptr<std::thread> local_c8;
  _Any_data local_b8;
  code *local_a8;
  long lStack_a0;
  pointer local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  EventLoop *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  PTR local_78;
  element_type *local_68;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  FRAME_CALLBACK *local_38;
  
  local_38 = callback;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->mServiceGuard);
  if (iVar7 == 0) {
    local_d8 = (pthread_mutex_t *)&this->mIOLoopGuard;
    local_d0 = (pthread_mutex_t *)&this->mServiceGuard;
    iVar7 = pthread_mutex_lock(local_d8);
    if (iVar7 == 0) {
      if ((this->mIOLoopDatas).
          super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->mIOLoopDatas).
          super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
        p_Var8->_M_use_count = 1;
        p_Var8->_M_weak_count = 1;
        p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00147cf8;
        *(undefined1 *)&p_Var8[1]._vptr__Sp_counted_base = 1;
        (this->mRunIOLoop).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(p_Var8 + 1);
        p_Var11 = (this->mRunIOLoop).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        (this->mRunIOLoop).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var8;
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
        }
        std::
        vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
        ::resize(&this->mIOLoopDatas,threadNum);
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (this->mIOLoopDatas).
                  super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_40._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->mIOLoopDatas).
             super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (p_Var11 != local_40._M_pi) {
          local_48 = (element_type *)&PTR___Sp_counted_ptr_inplace_00147d48;
          local_50._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               &PTR___Sp_counted_ptr_inplace_00147d98;
          local_58 = (element_type *)this;
          do {
            peVar6 = local_58;
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xe0);
            this_00->_M_use_count = 1;
            this_00->_M_weak_count = 1;
            this_00->_vptr__Sp_counted_base = (_func_int **)local_48;
            this_01 = (EventLoop *)(this_00 + 1);
            EventLoop::EventLoop(this_01);
            pfVar1 = (peVar6->mAsyncProcs).
                     super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            p_Var8 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &(peVar6->mAsyncProcs).
                      super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_pi;
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              }
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
            local_78.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 this_01;
            local_78.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = this_00;
            std::function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)>::function
                      ((function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)> *)&local_b8
                       ,local_38);
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              }
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
            local_c8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_98 = pfVar1;
            local_90 = p_Var8;
            local_88 = this_01;
            local_80 = this_00;
            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
            p_Var9->_M_use_count = 1;
            p_Var9->_M_weak_count = 1;
            p_Var9->_vptr__Sp_counted_base = (_func_int **)local_50._M_pi;
            p_Var9[1]._vptr__Sp_counted_base = (_func_int **)0x0;
            local_e0 = (long *)operator_new(0x48);
            p_Var3 = local_80;
            p_Var2 = local_90;
            *local_e0 = (long)&PTR___State_impl_00147b10;
            local_e0[1] = 0;
            local_e0[2] = 0;
            local_e0[3] = 0;
            local_e0[4] = lStack_a0;
            if (local_a8 != (code *)0x0) {
              *(undefined4 *)(local_e0 + 1) = local_b8._0_4_;
              *(undefined4 *)((long)local_e0 + 0xc) = local_b8._4_4_;
              *(undefined4 *)(local_e0 + 2) = local_b8._8_4_;
              *(undefined4 *)((long)local_e0 + 0x14) = local_b8._12_4_;
              local_e0[3] = (long)local_a8;
              local_a8 = (code *)0x0;
              lStack_a0 = 0;
            }
            local_e0[5] = (long)local_98;
            local_e0[6] = 0;
            local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_e0[6] = (long)p_Var2;
            local_98 = (pointer)0x0;
            local_e0[7] = (long)local_88;
            local_e0[8] = 0;
            local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_e0[8] = (long)p_Var3;
            local_88 = (EventLoop *)0x0;
            std::thread::_M_start_thread(p_Var9 + 1,&local_e0,0);
            if (local_e0 != (long *)0x0) {
              (**(code **)(*local_e0 + 8))();
            }
            local_c8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)(p_Var9 + 1);
            local_c8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 p_Var9;
            IOLoopData::Create((IOLoopData *)&local_68,&local_78,&local_c8);
            _Var5._M_pi = _Stack_60._M_pi;
            peVar4 = local_68;
            local_68 = (element_type *)0x0;
            _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var2 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var11->_M_use_count)->_M_pi;
            ((__shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2> *)
            &p_Var11->_vptr__Sp_counted_base)->_M_ptr = peVar4;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var11->_M_use_count)->_M_pi =
                 _Var5._M_pi;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            }
            if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
            }
            if (local_c8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
            }
            if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
            }
            if (local_a8 != (code *)0x0) {
              (*local_a8)(&local_b8,&local_b8,__destroy_functor);
            }
            if (local_78.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_78.
                         super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            p_Var11 = p_Var11 + 1;
          } while (p_Var11 != local_40._M_pi);
        }
      }
      pthread_mutex_unlock(local_d8);
      pthread_mutex_unlock(local_d0);
      return;
    }
  }
  else {
    iVar7 = std::__throw_system_error(iVar7);
  }
  uVar10 = std::__throw_system_error(iVar7);
  pthread_mutex_unlock(local_d8);
  pthread_mutex_unlock(local_d0);
  _Unwind_Resume(uVar10);
}

Assistant:

void TcpService::startWorkerThread(size_t threadNum, FRAME_CALLBACK callback)
{
    std::lock_guard<std::mutex> lck(mServiceGuard);
    std::lock_guard<std::mutex> lock(mIOLoopGuard);

    if (!mIOLoopDatas.empty())
    {
        return;
    }

    mRunIOLoop = std::make_shared<bool>(true);

    mIOLoopDatas.resize(threadNum);
    for (auto& v : mIOLoopDatas)
    {
        auto eventLoop = std::make_shared<EventLoop>();
        auto runIoLoop = mRunIOLoop;
        v = IOLoopData::Create(eventLoop, std::make_shared<std::thread>([callback,
            runIoLoop,
            eventLoop]() {
            while (*runIoLoop)
            {
                auto timeout = std::chrono::milliseconds(sDefaultLoopTimeOutMS);
                if (!eventLoop->getTimerMgr()->isEmpty())
                {
                    timeout = duration_cast<milliseconds>(eventLoop->getTimerMgr()->nearLeftTime());
                }
                eventLoop->loop(timeout.count());
                if (callback != nullptr)
                {
                    callback(eventLoop);
                }
            }
        }));
    }
}